

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_192_192_4_3(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x6d9badda8f970524,in_stack_ffffffffffffffe0,
                    (uint8_t *)0x43fcb7410186cb4a,(uint8_t *)0xcb1ee0bc06774979);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_3(void) {
  const uint8_t key[24] = {
      0x24, 0x5,  0x97, 0x8f, 0xda, 0xad, 0x9b, 0x6d, 0x8d, 0xcd, 0xd1, 0x8a,
      0xc,  0x2c, 0xe,  0xc6, 0x8b, 0x69, 0xdd, 0xa,  0x37, 0x54, 0xfe, 0x38,
  };
  const uint8_t plaintext[24] = {
      0x33, 0xe8, 0xb4, 0x55, 0x2e, 0x95, 0xef, 0x52, 0x79, 0x49, 0x77, 0x6,
      0xbc, 0xe0, 0x1e, 0xcb, 0x4a, 0xcb, 0x86, 0x1,  0x41, 0xb7, 0xfc, 0x43,
  };
  const uint8_t ciphertext_expected[24] = {
      0xdd, 0xaf, 0xf,  0x9d, 0x9e, 0xdd, 0x57, 0x20, 0x69, 0xa8, 0x94, 0x9f,
      0xae, 0xa0, 0xd1, 0xfd, 0x2d, 0x91, 0xef, 0x26, 0x2b, 0x41, 0x1c, 0xaf,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}